

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
~TypedExpectation(TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this)

{
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
  *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f7088;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
               *)*ppvVar1;
    if (this_00 !=
        (linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
         *)0x0) {
      linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
      ::~linked_ptr(this_00);
    }
    operator_delete(this_00,0x10);
  }
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>::
  ~linked_ptr(&(this->repeated_action_).impl_);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestPLTermBuilder,_BasicTestExpr<1>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f4c40;
  linked_ptr<const_testing::MatcherInterface<const_std::tuple<TestPLTermBuilder,_BasicTestExpr<1>_>_&>_>
  ::~linked_ptr(&(this->extra_matcher_).
                 super_MatcherBase<const_std::tuple<TestPLTermBuilder,_BasicTestExpr<1>_>_&>.impl_);
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestPLTermBuilder>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f0c90;
  linked_ptr<const_testing::MatcherInterface<TestPLTermBuilder>_>::~linked_ptr
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
              .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
              super_MatcherBase<TestPLTermBuilder>.impl_);
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f0b58;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
              .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
              super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
              super_MatcherBase<BasicTestExpr<1>_>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }